

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O3

void __thiscall
Temperature_Detection_Test::~Temperature_Detection_Test(Temperature_Detection_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Temperature, Detection)
{
    using namespace units;
    EXPECT_TRUE(is_temperature(degF));
    EXPECT_TRUE(is_temperature(precise::degF));
    EXPECT_TRUE(is_temperature(degC));
    EXPECT_TRUE(is_temperature(precise::degC));
    EXPECT_FALSE(is_temperature(K));
    EXPECT_FALSE(is_temperature(precise::K));

    EXPECT_FALSE(is_temperature(degF.inv()));
    EXPECT_FALSE(is_temperature(precise::degF.inv()));
    // this is correct since 1 C != 1 K in absolute temperature
    // but per deg C is equal to per Kelvin so this is the desired behavior
    EXPECT_FALSE(degC == K);
    EXPECT_FALSE(precise::degC == precise::K);
    EXPECT_TRUE(precise::degC.inv().inv() == precise::degC);
}